

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O2

void pnga_print_patch_file(FILE *file,Integer g_a,Integer *lo,Integer *hi,Integer pretty)

{
  int iVar1;
  bool bVar2;
  Integer IVar3;
  DoublePrecision *pDVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint *puVar8;
  uint *puVar9;
  double *pdVar10;
  long *plVar11;
  longlong *plVar12;
  float *pfVar13;
  long *plVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  float fVar22;
  double dVar23;
  Integer ndim;
  long *local_a20;
  Integer lop [7];
  Integer hip [7];
  Integer type;
  long local_988;
  long local_980;
  ulong local_978;
  char *name;
  long local_968;
  float *local_960;
  double *local_958;
  float *local_950;
  double *local_948;
  longlong *local_940;
  Integer ld [7];
  Integer dims [7];
  float fbuf [6];
  int ibuf [6];
  DoublePrecision dbuf_2d [36];
  longlong llbuf [6];
  long lbuf [6];
  DoublePrecision dbuf [6];
  DoublePrecision dcbuf [12];
  
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  pnga_sync();
  pnga_check_handle(g_a,"nga_print");
  IVar3 = pnga_nodeid();
  if (IVar3 == 0) {
    local_a20 = hi;
    pnga_inquire(g_a,&type,&ndim,dims);
    pnga_inquire_name(g_a,&name);
    for (lVar6 = 0; lVar6 < ndim; lVar6 = lVar6 + 1) {
      if ((lo[lVar6] < 1) || (dims[lVar6] < local_a20[lVar6])) {
        pnga_error("g_a indices out of range ",g_a);
      }
    }
    fprintf((FILE *)file,"\n global array: %s[",name);
    for (lVar6 = 0; lVar6 < ndim; lVar6 = lVar6 + 1) {
      pcVar15 = "%ld:%ld,";
      if (lVar6 == ndim + -1) {
        pcVar15 = "%ld:%ld";
      }
      fprintf((FILE *)file,pcVar15,lo[lVar6],local_a20[lVar6]);
    }
    uVar7 = 0;
    fprintf((FILE *)file,"],  handle: %d \n",g_a);
    lVar6 = (ulong)(type != 0x3ee) * 3;
    lVar19 = lVar6 + 3;
    uVar20 = 0;
    if (0 < ndim) {
      uVar20 = ndim;
    }
    for (; uVar20 != uVar7; uVar7 = uVar7 + 1) {
      ld[uVar7] = lVar19;
    }
    local_968 = lVar19;
    if (pretty == 0) {
      for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
        IVar3 = lo[uVar7];
        lop[uVar7] = IVar3;
        hip[uVar7] = IVar3;
      }
      local_978 = lVar6 + 2;
      hip[0] = lop[0] + local_978;
      if (*local_a20 <= (long)(lop[0] + local_978)) {
        hip[0] = *local_a20;
      }
      bVar2 = true;
      while (bVar2) {
        switch(type) {
        case 0x3e9:
          pDVar4 = (DoublePrecision *)ibuf;
          break;
        case 0x3ea:
          pDVar4 = (DoublePrecision *)lbuf;
          break;
        case 0x3eb:
          pDVar4 = (DoublePrecision *)fbuf;
          break;
        case 0x3ec:
          pDVar4 = dbuf;
          break;
        default:
          pnga_error("ga_print: wrong type",0);
          goto LAB_0011eb9d;
        case 0x3ee:
          pDVar4 = dbuf_2d;
          break;
        case 0x3ef:
          pDVar4 = dcbuf;
          break;
        case 0x3f8:
          pDVar4 = (DoublePrecision *)llbuf;
        }
        pnga_get(g_a,lop,hip,pDVar4,ld);
LAB_0011eb9d:
        for (lVar6 = 0; lVar6 <= hip[0] - lop[0]; lVar6 = lVar6 + 1) {
          fprintf((FILE *)file,"%s(",name);
          for (lVar19 = 0; lVar19 < ndim; lVar19 = lVar19 + 1) {
            if (ndim == 1) {
              lVar5 = lop[0] + lVar6;
LAB_0011ebf9:
              pcVar15 = "%ld";
            }
            else {
              if (lVar19 == 0) {
                lVar5 = lop[0] + lVar6;
              }
              else {
                lVar5 = lop[lVar19];
                if (lVar19 == ndim + -1) goto LAB_0011ebf9;
              }
              pcVar15 = "%ld,";
            }
            fprintf((FILE *)file,pcVar15,lVar5);
          }
          if (0xf < type - 0x3e9U) goto switchD_0011ec46_caseD_3ed;
          lVar19 = lVar6 * 2 + 1;
          switch(type) {
          case 0x3e9:
            fprintf((FILE *)file,") = %d\n",(ulong)(uint)ibuf[lVar6]);
            break;
          case 0x3ea:
            lVar19 = lbuf[lVar6];
            pcVar15 = ") = %ld\n";
            goto LAB_0011ecd2;
          case 0x3eb:
            dVar21 = (double)fbuf[lVar6];
LAB_0011ed00:
            pcVar15 = ") = %f\n";
            goto LAB_0011ed72;
          case 0x3ec:
            dVar21 = dbuf[lVar6];
            if (dVar21 < 100000.0) goto LAB_0011ed00;
            pcVar15 = ") = %e\n";
LAB_0011ed72:
            fprintf((FILE *)file,pcVar15,dVar21);
            break;
          case 0x3ee:
            dVar21 = (double)*(float *)(dbuf_2d + lVar6);
            if ((*(float *)(dbuf_2d + lVar6) < 100000.0) &&
               (fVar22 = *(float *)((long)dbuf_2d + lVar19 * 4), fVar22 < 100000.0)) {
              dVar23 = (double)fVar22;
              goto LAB_0011ed40;
            }
            dVar23 = (double)*(float *)((long)dbuf_2d + lVar19 * 4);
LAB_0011ed55:
            pcVar15 = ") = (%e,%e)\n";
            goto LAB_0011ed5f;
          case 0x3ef:
            dVar21 = dcbuf[lVar6 * 2];
            if ((100000.0 <= dVar21) || (dVar23 = dcbuf[lVar19], 100000.0 <= dVar23)) {
              dVar23 = dcbuf[lVar19];
              goto LAB_0011ed55;
            }
LAB_0011ed40:
            pcVar15 = ") = (%f,%f)\n";
LAB_0011ed5f:
            fprintf((FILE *)file,pcVar15,dVar21,dVar23);
            break;
          case 0x3f8:
            lVar19 = llbuf[lVar6];
            pcVar15 = ") = %lld\n";
LAB_0011ecd2:
            fprintf((FILE *)file,pcVar15,lVar19);
          }
switchD_0011ec46_caseD_3ed:
        }
        fflush((FILE *)file);
        uVar20 = local_978;
        lop[0] = hip[0] + 1;
        lVar6 = hip[0] + local_968;
        if (*local_a20 <= hip[0] + local_968) {
          lVar6 = *local_a20;
        }
        hip[0] = lVar6;
        IVar3 = ndim;
        if (ndim < 1) {
          IVar3 = 0;
        }
        bVar2 = true;
        for (lVar6 = 0; IVar3 != lVar6; lVar6 = lVar6 + 1) {
          lVar19 = local_a20[lVar6];
          if (lVar19 < lop[lVar6]) {
            if (ndim + -1 == lVar6) {
              bVar2 = false;
            }
            else {
              lVar5 = lo[lVar6];
              lop[lVar6] = lVar5;
              if (lVar6 == 0) {
                hip[0] = lVar5 + uVar20;
                if (lVar19 <= (long)(lVar5 + uVar20)) {
                  hip[0] = lVar19;
                }
              }
              else {
                hip[lVar6] = lVar5;
              }
              lop[lVar6 + 1] = lop[lVar6 + 1] + 1;
              hip[lVar6 + 1] = hip[lVar6 + 1] + 1;
            }
          }
        }
      }
    }
    else {
      lVar5 = 1;
      for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
        lVar16 = lo[uVar7];
        lop[uVar7] = lVar16;
        if (uVar7 < 2) {
          lVar16 = lVar16 + lVar6 + 2;
          if (local_a20[uVar7] <= lVar16) {
            lVar16 = local_a20[uVar7];
          }
        }
        hip[uVar7] = lVar16;
      }
      iVar1 = (int)lVar19;
      uVar20 = (ulong)(uint)(iVar1 * 8);
      local_978 = (ulong)(uint)(iVar1 * 4);
      local_988 = 1;
      local_980 = 1;
      while (plVar14 = local_a20, lVar5 != 0) {
        if (2 < ndim && local_980 != 0) {
          fprintf((FILE *)file,"\n -- patch: %s[",name);
          for (uVar7 = 0; (long)uVar7 < ndim; uVar7 = uVar7 + 1) {
            if (uVar7 < 2) {
              if (uVar7 == ndim - 1U) {
                pcVar15 = "%ld:%ld";
              }
              else {
                pcVar15 = "%ld:%ld,";
              }
              fprintf((FILE *)file,pcVar15,lo[uVar7],plVar14[uVar7]);
            }
            else {
              if (uVar7 == ndim - 1U) {
                pcVar15 = "%ld";
              }
              else {
                pcVar15 = "%ld,";
              }
              fprintf((FILE *)file,pcVar15,lop[uVar7]);
            }
          }
          fwrite("]\n",2,1,(FILE *)file);
          local_980 = 0;
        }
        if ((local_988 != 0) && (1 < ndim)) {
          fputc(10,(FILE *)file);
          switch(type) {
          case 0x3e9:
            fwrite("     ",5,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fprintf((FILE *)file,"%7ld  ",IVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fwrite(" --------",9,1,(FILE *)file);
            }
            break;
          case 0x3ea:
            fwrite("     ",5,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fprintf((FILE *)file,"%7ld  ",IVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fwrite(" --------",9,1,(FILE *)file);
            }
            break;
          case 0x3eb:
            fwrite("     ",5,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fprintf((FILE *)file,"%7ld  ",IVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fwrite(" --------",9,1,(FILE *)file);
            }
            break;
          case 0x3ec:
            fwrite("   ",3,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fprintf((FILE *)file,"%10ld  ",IVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fwrite(" -----------",0xc,1,(FILE *)file);
            }
            break;
          default:
            pnga_error("ga_print: wrong type",0);
            break;
          case 0x3ee:
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fprintf((FILE *)file,"%22ld  ",IVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fwrite(" -----------------------",0x18,1,(FILE *)file);
            }
            break;
          case 0x3ef:
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fprintf((FILE *)file,"%22ld  ",IVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fwrite(" -----------------------",0x18,1,(FILE *)file);
            }
            break;
          case 0x3f8:
            fwrite("     ",5,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fprintf((FILE *)file,"%7ld  ",IVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            for (IVar3 = lop[1]; IVar3 <= hip[1]; IVar3 = IVar3 + 1) {
              fwrite(" --------",9,1,(FILE *)file);
            }
          }
          fputc(10,(FILE *)file);
          local_988 = 0;
        }
        switch(type) {
        case 0x3e9:
          pDVar4 = (DoublePrecision *)ibuf;
          break;
        case 0x3ea:
          pDVar4 = (DoublePrecision *)lbuf;
          break;
        case 0x3eb:
          pDVar4 = (DoublePrecision *)fbuf;
          break;
        case 0x3ec:
          pDVar4 = dbuf_2d;
          break;
        default:
          pnga_error("ga_print: wrong type",0);
          goto LAB_0011e16b;
        case 0x3ee:
          pDVar4 = dbuf;
          break;
        case 0x3ef:
          pDVar4 = dcbuf;
          break;
        case 0x3f8:
          pDVar4 = (DoublePrecision *)llbuf;
        }
        pnga_get(g_a,lop,hip,pDVar4,ld);
LAB_0011e16b:
        puVar8 = (uint *)ibuf;
        plVar14 = lbuf;
        local_940 = llbuf;
        local_948 = dbuf_2d;
        local_950 = fbuf;
        local_958 = dcbuf + 1;
        local_960 = (float *)((long)dbuf + 4);
        for (lVar19 = 0; lVar16 = local_968, lVar19 <= hip[0] - lop[0]; lVar19 = lVar19 + 1) {
          fprintf((FILE *)file,"%4ld  ",lop[0] + lVar19);
          switch(type) {
          case 0x3e9:
            if (ndim < 2) {
              fprintf((FILE *)file," %8d",(ulong)(uint)ibuf[lVar19]);
            }
            else {
              puVar9 = puVar8;
              for (lVar5 = 0; lVar5 <= hip[1] - lop[1]; lVar5 = lVar5 + 1) {
                fprintf((FILE *)file," %8d",(ulong)*puVar9);
                puVar9 = (uint *)((long)puVar9 + local_978);
              }
            }
            break;
          case 0x3ea:
            if (ndim < 2) {
              lVar5 = lbuf[lVar19];
              pcVar15 = " %8ld";
LAB_0011e54c:
              fprintf((FILE *)file,pcVar15,lVar5);
            }
            else {
              plVar11 = plVar14;
              for (lVar5 = 0; lVar5 <= hip[1] - lop[1]; lVar5 = lVar5 + 1) {
                fprintf((FILE *)file," %8ld",*plVar11);
                plVar11 = (long *)((long)plVar11 + uVar20);
              }
            }
            break;
          case 0x3eb:
            if (ndim < 2) {
              dVar21 = (double)fbuf[lVar19];
LAB_0011e57f:
              pcVar15 = " %11.5f";
LAB_0011e5fa:
              fprintf((FILE *)file,pcVar15,dVar21);
            }
            else {
              pfVar13 = local_950;
              for (lVar5 = 0; lVar5 <= hip[1] - lop[1]; lVar5 = lVar5 + 1) {
                fprintf((FILE *)file," %11.5f",(double)*pfVar13);
                pfVar13 = (float *)((long)pfVar13 + local_978);
              }
            }
            break;
          case 0x3ec:
            if (ndim < 2) {
              dVar21 = dbuf_2d[lVar19];
              if (dVar21 < 100000.0) goto LAB_0011e57f;
              pcVar15 = " %.5e";
              goto LAB_0011e5fa;
            }
            pdVar10 = local_948;
            for (lVar5 = 0; lVar5 <= hip[1] - lop[1]; lVar5 = lVar5 + 1) {
              pcVar15 = " %11.5f";
              if (100000.0 <= *pdVar10) {
                pcVar15 = " %.5e";
              }
              fprintf((FILE *)file,pcVar15);
              pdVar10 = (double *)((long)pdVar10 + uVar20);
            }
            break;
          default:
            pnga_error("ga_print: wrong data type",0);
            break;
          case 0x3ee:
            if (ndim < 2) {
              dVar21 = (double)*(float *)(dbuf + lVar19);
              lVar5 = lVar19 * 2 + 1;
              if ((*(float *)(dbuf + lVar19) < 100000.0) &&
                 (fVar22 = *(float *)((long)dbuf + lVar5 * 4), fVar22 < 100000.0)) {
                dVar23 = (double)fVar22;
                goto LAB_0011e5c8;
              }
              dVar23 = (double)*(float *)((long)dbuf + lVar5 * 4);
LAB_0011e5dd:
              pcVar15 = " %.5e,%.5e";
LAB_0011e5e7:
              fprintf((FILE *)file,pcVar15,dVar21,dVar23);
            }
            else {
              pfVar13 = local_960;
              for (lVar5 = 0; lVar5 <= hip[1] - lop[1]; lVar5 = lVar5 + 1) {
                if (100000.0 <= pfVar13[-1]) {
LAB_0011e491:
                  fVar22 = *pfVar13;
                  pcVar15 = " %.5e,%.5e";
                }
                else {
                  fVar22 = *pfVar13;
                  pcVar15 = " %11.5f,%11.5f";
                  if (100000.0 <= fVar22) goto LAB_0011e491;
                }
                fprintf((FILE *)file,pcVar15,(double)pfVar13[-1],(double)fVar22);
                pfVar13 = (float *)((long)pfVar13 + uVar20);
              }
            }
            break;
          case 0x3ef:
            if (ndim < 2) {
              dVar21 = dcbuf[lVar19 * 2];
              lVar5 = lVar19 * 2 + 1;
              if ((100000.0 <= dVar21) || (dVar23 = dcbuf[lVar5], 100000.0 <= dVar23)) {
                dVar23 = dcbuf[lVar5];
                goto LAB_0011e5dd;
              }
LAB_0011e5c8:
              pcVar15 = " %11.5f,%11.5f";
              goto LAB_0011e5e7;
            }
            pdVar10 = local_958;
            for (lVar5 = 0; lVar5 <= hip[1] - lop[1]; lVar5 = lVar5 + 1) {
              if ((100000.0 <= pdVar10[-1]) || (dVar21 = *pdVar10, 100000.0 <= dVar21)) {
                dVar21 = *pdVar10;
                pcVar15 = " %.5e,%.5e";
              }
              else {
                pcVar15 = " %11.5f,%11.5f";
              }
              fprintf((FILE *)file,pcVar15,pdVar10[-1],dVar21);
              pdVar10 = (double *)((long)pdVar10 + (ulong)(uint)(iVar1 << 4));
            }
            break;
          case 0x3f8:
            if (ndim < 2) {
              lVar5 = llbuf[lVar19];
              pcVar15 = " %8lld";
              goto LAB_0011e54c;
            }
            plVar12 = local_940;
            for (lVar5 = 0; lVar5 <= hip[1] - lop[1]; lVar5 = lVar5 + 1) {
              fprintf((FILE *)file," %8lld",*plVar12);
              plVar12 = (longlong *)((long)plVar12 + uVar20);
            }
          }
          fputc(10,(FILE *)file);
          local_960 = local_960 + 2;
          local_958 = local_958 + 2;
          local_950 = local_950 + 1;
          local_948 = local_948 + 1;
          local_940 = local_940 + 1;
          plVar14 = plVar14 + 1;
          puVar8 = puVar8 + 1;
        }
        lop[0] = hip[0] + 1;
        lVar19 = hip[0] + local_968;
        if (*local_a20 <= hip[0] + local_968) {
          lVar19 = *local_a20;
        }
        hip[0] = lVar19;
        uVar7 = 0;
        if (0 < ndim) {
          uVar7 = ndim;
        }
        lVar5 = 1;
        for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
          lVar19 = local_a20[uVar17];
          if (lVar19 < lop[uVar17]) {
            if ((1 - ndim) + uVar17 == 0) {
              lVar5 = 0;
            }
            else {
              lVar18 = lo[uVar17];
              lop[uVar17] = lVar18;
              if (uVar17 < 2) {
                lVar18 = lVar18 + lVar6 + 2;
                if (lVar19 <= lVar18) {
                  lVar18 = lVar19;
                }
                hip[uVar17] = lVar18;
                if (uVar17 != 0) goto LAB_0011e71c;
                lop[1] = hip[1] + 1;
                lVar19 = hip[1] + lVar16;
                if (local_a20[1] <= hip[1] + lVar16) {
                  lVar19 = local_a20[1];
                }
                hip[1] = lVar19;
              }
              else {
                hip[uVar17] = lVar18;
LAB_0011e71c:
                lop[uVar17 + 1] = lop[uVar17 + 1] + 1;
                hip[uVar17 + 1] = hip[uVar17 + 1] + 1;
              }
              if (uVar17 == 0) {
                local_988 = 1;
              }
              if (uVar17 == 1) {
                local_980 = 1;
              }
            }
          }
        }
      }
    }
    fflush((FILE *)file);
  }
  pnga_sync();
  return;
}

Assistant:

void pnga_print_patch_file(file, g_a, lo, hi, pretty)
        Integer g_a, *lo, *hi, pretty;
        FILE *file;
/*
  Pretty = 0 ... spew output out with no formatting
  Pretty = 1 ... format output so that it is readable
*/  
{
#define BUFSIZE 6
#define FLEN 80 

    Integer i, j;
    Integer type;
    char *name;
    Integer ndim, dims[MAXDIM], ld[MAXDIM];
    Integer bufsize;
    int ibuf[BUFSIZE], ibuf_2d[BUFSIZE*BUFSIZE];
    DoublePrecision dbuf[BUFSIZE], dbuf_2d[BUFSIZE*BUFSIZE];
    DoublePrecision dcbuf[2*BUFSIZE], dcbuf_2d[2*BUFSIZE*BUFSIZE];
    float fbuf[BUFSIZE], fbuf_2d[BUFSIZE*BUFSIZE];
    float fcbuf[2*BUFSIZE], fcbuf_2d[3*BUFSIZE*BUFSIZE];
    Integer lop[MAXDIM], hip[MAXDIM];
    long lbuf[BUFSIZE], lbuf_2d[BUFSIZE*BUFSIZE];
    long long llbuf[BUFSIZE], llbuf_2d[BUFSIZE*BUFSIZE];
    Integer done, status_2d, status_3d;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    pnga_sync();
    pnga_check_handle(g_a, "nga_print");

    /* only the first process print the array */
    if(pnga_nodeid() == 0) {
        
        pnga_inquire(g_a,  &type, &ndim, dims);
        pnga_inquire_name(g_a, &name);
        
        /* check the boundary */
        for(i=0; i<ndim; i++)
            if(lo[i] <= 0 || hi[i] > dims[i]) 
                pnga_error("g_a indices out of range ", g_a);
        
        /* print the general information */
        fprintf(file,"\n global array: %s[", name);
        for(i=0; i<ndim; i++)
            if(i != (ndim-1))
                fprintf(file, "%ld:%ld,", (long)lo[i], (long)hi[i]);
            else
                fprintf(file, "%ld:%ld",  (long)lo[i], (long)hi[i]);
        fprintf(file,"],  handle: %d \n", (int)g_a);
        
        bufsize = (type==C_DCPL)? BUFSIZE/2 : BUFSIZE;
        bufsize = (type==C_SCPL)? BUFSIZE/2 : BUFSIZE;
        
        for(i=0; i<ndim; i++) ld[i] = bufsize;
        
        if(!pretty) {
            done = 1;
            for(i=0; i<ndim; i++) {
                lop[i] = lo[i]; hip[i] = lo[i];
            }
            hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
            while(done) {
                switch(type) {
                    case C_INT:      pnga_get(g_a, lop, hip, ibuf, ld); break;
                    case C_DBL:      pnga_get(g_a, lop, hip, dbuf, ld); break;
                    case C_DCPL:     pnga_get(g_a, lop, hip, dcbuf, ld); break;
                    case C_FLOAT:    pnga_get(g_a, lop, hip, fbuf, ld); break; 
                    case C_SCPL:     pnga_get(g_a, lop, hip, fcbuf, ld); break;
                    case C_LONG:     pnga_get(g_a, lop, hip, lbuf, ld); break; 
                    case C_LONGLONG: pnga_get(g_a, lop, hip, llbuf,ld); break;
                    default: pnga_error("ga_print: wrong type",0);
                }
                
                /* print the array */
                for(i=0; i<(hip[0]-lop[0]+1); i++) {
                    fprintf(file,"%s(", name);
                    for(j=0; j<ndim; j++)
                        if((j == 0) && (j == (ndim-1)))
                            fprintf(file, "%ld", (long)lop[j]+i);
                        else if((j != 0) && (j == (ndim-1)))
                            fprintf(file, "%ld", (long)lop[j]);
                        else if((j == 0) && (j != (ndim-1)))
                            fprintf(file, "%ld,", (long)lop[j]+i);
                        else fprintf(file, "%ld,", (long)lop[j]);
                    switch(type) {
                        case C_INT:
                            fprintf(file,") = %d\n", ibuf[i]);break;
                        case C_LONG:
                            fprintf(file,") = %ld\n", lbuf[i]);break;
                        case C_LONGLONG:
                            fprintf(file,") = %lld\n", llbuf[i]);break;
                        case C_DBL:
                            if((double)dbuf[i]<100000.0)
                                fprintf(file,") = %f\n", dbuf[i]);
                            else fprintf(file,") = %e\n", dbuf[i]);
                            break;
                        case C_DCPL:
                            if(((double)dcbuf[i*2]<100000.0) &&
                               ((double)dcbuf[i*2+1]<100000.0))
                                fprintf(file,") = (%f,%f)\n",
                                        dcbuf[i*2],dcbuf[i*2+1]);
                            else
                                fprintf(file,") = (%e,%e)\n",
                                        dcbuf[i*2],dcbuf[i*2+1]);
                            break;
                        case C_SCPL:
                            if(((float)fcbuf[i*2]<100000.0) &&
                               ((float)fcbuf[i*2+1]<100000.0))
                                fprintf(file,") = (%f,%f)\n",
                                        fcbuf[i*2],fcbuf[i*2+1]);
                            else
                                fprintf(file,") = (%e,%e)\n",
                                        fcbuf[i*2],fcbuf[i*2+1]);
                            break;
                        case C_FLOAT: fprintf(file,") = %f\n", fbuf[i]);break; 
                    }
                }
                
                fflush(file);
                
                lop[0] = hip[0]+1; hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
                
                for(i=0; i<ndim; i++) {
                    if(lop[i] > hi[i]) {
                        if(i == (ndim-1)) {
                            done = 0;
                        } else {
                            lop[i] = lo[i];
                            if(i == 0) hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                            else hip[i] = lo[i];
                            lop[i+1]++; hip[i+1]++;
                        }
                    }
                }
            }
        }
        else {
            /* pretty print */
            done = 1;
            for(i=0; i<ndim; i++) {
                lop[i] = lo[i];
                if((i == 0) || (i == 1))
                    hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                else 
                    hip[i] = lo[i];
            }
            
            status_2d = 1; status_3d = 1;
            
            while(done) {
                if(status_3d && (ndim > 2)) { /* print the patch info */
                    fprintf(file,"\n -- patch: %s[", name);
                    for(i=0; i<ndim; i++)
                        if(i < 2)
                            if(i != (ndim-1))
                                fprintf(file, "%ld:%ld,", (long)lo[i], (long)hi[i]);
                            else
                                fprintf(file, "%ld:%ld", (long)lo[i], (long)hi[i]);
                        else
                            if(i != (ndim-1))
                                fprintf(file, "%ld,", (long)lop[i]);
                            else
                                fprintf(file, "%ld", (long)lop[i]);
                    fprintf(file,"]\n"); status_3d = 0;
                }
                
                if(status_2d &&(ndim > 1)) {
                    fprintf(file, "\n"); 
                    switch(type) {
                        case C_INT:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_LONG:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_LONGLONG:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_DBL:
                            fprintf(file, "   ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%10ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------");
                            break;
                        case C_DCPL:
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%22ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------------------");
                            break;
                        case C_SCPL:
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%22ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------------------");
                            break;
                        case C_FLOAT:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                       default:
                         pnga_error("ga_print: wrong type", 0);
                    }
                    
                    fprintf(file,"\n");
                    status_2d = 0;
                }
                
                switch(type) {
                    case C_INT: pnga_get(g_a, lop, hip, ibuf_2d, ld); break;
                    case C_LONG: pnga_get(g_a, lop, hip,lbuf_2d, ld); break;
                    case C_LONGLONG: pnga_get(g_a, lop, hip,llbuf_2d,ld);break;
                    case C_DBL: pnga_get(g_a, lop, hip, dbuf_2d, ld); break;
                    case C_DCPL: pnga_get(g_a, lop, hip, dcbuf_2d, ld);break;
                    case C_FLOAT: pnga_get(g_a, lop, hip, fbuf_2d, ld);break;
                    case C_SCPL: pnga_get(g_a, lop, hip, fcbuf_2d, ld);break;  
                   default: pnga_error("ga_print: wrong type",0);
                }
                
                for(i=0; i<(hip[0]-lop[0]+1); i++) {
                    fprintf(file,"%4ld  ", (long)(lop[0]+i));
                    switch(type) {
                        case C_INT:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %8d", ibuf_2d[j*bufsize+i]);
                            else fprintf(file," %8d", ibuf_2d[i]);
                            break;
                        case C_LONG:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %8ld",lbuf_2d[j*bufsize+i]);
                            else fprintf(file," %8ld",lbuf_2d[i]);
                            break;
                        case C_LONGLONG:
                            if(ndim > 1)
                               for(j=0; j<(hip[1]-lop[1]+1); j++)
                                  fprintf(file," %8lld",llbuf_2d[j*bufsize+i]);
                            else fprintf(file," %8lld",llbuf_2d[i]);
                            break;
                        case C_DBL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if((double)dbuf_2d[j*bufsize+i]<100000.0)
                                        fprintf(file," %11.5f",
                                                dbuf_2d[j*bufsize+i]);
                                    else
                                        fprintf(file," %.5e",
                                                dbuf_2d[j*bufsize+i]);
                            else
                                if((double)dbuf_2d[i]<100000.0)
                                    fprintf(file," %11.5f",dbuf_2d[i]);
                                else
                                    fprintf(file," %.5e",dbuf_2d[i]);
                            break;
                        case C_FLOAT:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %11.5f", fbuf_2d[j*bufsize+i]);
                            else fprintf(file," %11.5f", fbuf_2d[i]);
                            break;           
                        case C_DCPL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if(((double)dcbuf_2d[(j*bufsize+i)*2]<100000.0)&&((double)dcbuf_2d[(j*bufsize+i)*2+1]<100000.0))
                                        fprintf(file," %11.5f,%11.5f",
                                                dcbuf_2d[(j*bufsize+i)*2],
                                                dcbuf_2d[(j*bufsize+i)*2+1]);
                                    else
                                        fprintf(file," %.5e,%.5e",
                                                dcbuf_2d[(j*bufsize+i)*2],
                                                dcbuf_2d[(j*bufsize+i)*2+1]);
                            else
                                if(((double)dcbuf_2d[i*2]<100000.0) &&
                                   ((double)dcbuf_2d[i*2+1]<100000.0))
                                    fprintf(file," %11.5f,%11.5f",
                                            dcbuf_2d[i*2], dcbuf_2d[i*2+1]);
                                else
                                    fprintf(file," %.5e,%.5e",
                                            dcbuf_2d[i*2], dcbuf_2d[i*2+1]);
			    break;
                        case C_SCPL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if(((float)fcbuf_2d[(j*bufsize+i)*2]<100000.0)&&((float)fcbuf_2d[(j*bufsize+i)*2+1]<100000.0))
                                        fprintf(file," %11.5f,%11.5f",
                                                fcbuf_2d[(j*bufsize+i)*2],
                                                fcbuf_2d[(j*bufsize+i)*2+1]);
                                    else
                                        fprintf(file," %.5e,%.5e",
                                                fcbuf_2d[(j*bufsize+i)*2],
                                                fcbuf_2d[(j*bufsize+i)*2+1]);
                            else
                                if(((float)fcbuf_2d[i*2]<100000.0) &&
                                   ((float)fcbuf_2d[i*2+1]<100000.0))
                                    fprintf(file," %11.5f,%11.5f",
                                            fcbuf_2d[i*2], fcbuf_2d[i*2+1]);
                                else
                                    fprintf(file," %.5e,%.5e",
                                            fcbuf_2d[i*2], fcbuf_2d[i*2+1]);
                            break;
                       default:
                          pnga_error("ga_print: wrong data type", 0);
                    }
                    
                    fprintf(file,"\n");
                }
                
                lop[0] = hip[0]+1; hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
                
                for(i=0; i<ndim; i++) {
                    if(lop[i] > hi[i]) {
                        if(i == (ndim-1)) {
                            done = 0;
                        } else {
                            lop[i] = lo[i];
                            
                            if((i == 0) || (i == 1)) {
                                hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                            } else {
                                hip[i] = lo[i];
                            }
                            
                            if(i == 0) {
                                lop[i+1] = hip[i+1]+1;
                                hip[i+1] = GA_MIN(lop[i+1]+bufsize-1, hi[i+1]);
                            } else {
                                lop[i+1]++; hip[i+1]++;
                            }
                            
                            if(i == 0) status_2d = 1;
                            if(i == 1) status_3d = 1;
                        }
                    }
                }
            }
        }
        fflush(file);
    }
    
    pnga_sync();
}